

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O0

Tracer * __thiscall jaegertracing::Span::tracer(Span *this)

{
  bool bVar1;
  undefined1 local_38 [8];
  shared_ptr<opentracing::v3::Tracer> tracer;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Span *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_tracer);
  if (bVar1) {
    this_local = (Span *)std::
                         __shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*((__shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&this->_tracer);
    tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = 1;
  }
  else {
    opentracing::v3::Tracer::Global();
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (!bVar1) {
      __assert_fail("tracer",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Span.cpp"
                    ,0x7e,"virtual const opentracing::Tracer &jaegertracing::Span::tracer() const");
    }
    this_local = (Span *)std::
                         __shared_ptr_access<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*((__shared_ptr_access<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_38);
    tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = 1;
    std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
              ((shared_ptr<opentracing::v3::Tracer> *)local_38);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (Tracer *)this_local;
}

Assistant:

const opentracing::Tracer& Span::tracer() const noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    if (_tracer) {
        return *_tracer;
    }
    auto tracer = opentracing::Tracer::Global();
    assert(tracer);
    return *tracer;
}